

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsslserver.cpp
# Opt level: O2

void QSslServer::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  undefined8 *puVar2;
  InterfaceType *pIVar3;
  
  if (_c != RegisterMethodArgumentMetaType) {
    if (_c != IndexOfMethod) {
      if (_c != InvokeMetaMethod) {
        return;
      }
      switch(_id) {
      case 0:
        sslErrors((QSslServer *)_o,*_a[1],(QList<QSslError> *)_a[2]);
        return;
      case 1:
        peerVerifyError((QSslServer *)_o,*_a[1],(QSslError *)_a[2]);
        return;
      case 2:
        errorOccurred((QSslServer *)_o,*_a[1],*_a[2]);
        return;
      case 3:
        preSharedKeyAuthenticationRequired((QSslServer *)_o,*_a[1],*_a[2]);
        return;
      case 4:
        alertSent((QSslServer *)_o,*_a[1],*_a[2],*_a[3],(QString *)_a[4]);
        return;
      case 5:
        alertReceived((QSslServer *)_o,*_a[1],*_a[2],*_a[3],(QString *)_a[4]);
        return;
      case 6:
        handshakeInterruptedOnError((QSslServer *)_o,*_a[1],(QSslError *)_a[2]);
        return;
      case 7:
        startedEncryptionHandshake((QSslServer *)_o,*_a[1]);
        return;
      default:
        return;
      }
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QSslServer::*)(QSslSocket*,QList<QSslError>const&)>
                      ((QtMocHelpers *)_a,(void **)sslErrors,0,0);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QSslServer::*)(QSslSocket*,QSslError_const&)>
                      ((QtMocHelpers *)_a,(void **)peerVerifyError,0,1);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::
            indexOfMethod<void(QSslServer::*)(QSslSocket*,QAbstractSocket::SocketError)>
                      ((QtMocHelpers *)_a,(void **)errorOccurred,0,2);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::
            indexOfMethod<void(QSslServer::*)(QSslSocket*,QSslPreSharedKeyAuthenticator*)>
                      ((QtMocHelpers *)_a,(void **)preSharedKeyAuthenticationRequired,0,3);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::
            indexOfMethod<void(QSslServer::*)(QSslSocket*,QSsl::AlertLevel,QSsl::AlertType,QString_const&)>
                      ((QtMocHelpers *)_a,(void **)alertSent,0,4);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::
            indexOfMethod<void(QSslServer::*)(QSslSocket*,QSsl::AlertLevel,QSsl::AlertType,QString_const&)>
                      ((QtMocHelpers *)_a,(void **)alertReceived,0,5);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QSslServer::*)(QSslSocket*,QSslError_const&)>
                      ((QtMocHelpers *)_a,(void **)handshakeInterruptedOnError,0,6);
    if (bVar1) {
      return;
    }
    QtMocHelpers::indexOfMethod<void(QSslServer::*)(QSslSocket*)>
              ((QtMocHelpers *)_a,(void **)startedEncryptionHandshake,0,7);
    return;
  }
  switch(_id) {
  case 0:
    puVar2 = (undefined8 *)*_a;
    if (*_a[1] != 0) {
      if (*_a[1] != 1) goto LAB_00237185;
      pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QSslError>_>::metaType;
      goto LAB_00237098;
    }
    break;
  case 1:
  case 4:
  case 5:
  case 6:
  case 7:
    puVar2 = (undefined8 *)*_a;
    if (*_a[1] != 0) goto LAB_00237185;
    break;
  case 2:
    puVar2 = (undefined8 *)*_a;
    if (*_a[1] != 0) {
      if (*_a[1] == 1) {
        pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractSocket::SocketError>::metaType;
        goto LAB_00237098;
      }
      goto LAB_00237185;
    }
    break;
  case 3:
    puVar2 = (undefined8 *)*_a;
    if (*_a[1] != 0) {
      if (*_a[1] == 1) {
        pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QSslPreSharedKeyAuthenticator_*>::metaType;
        goto LAB_00237098;
      }
      goto LAB_00237185;
    }
    break;
  default:
    puVar2 = (undefined8 *)*_a;
LAB_00237185:
    *puVar2 = 0;
    return;
  }
  pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QSslSocket_*>::metaType;
LAB_00237098:
  *puVar2 = pIVar3;
  return;
}

Assistant:

void QSslServer::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSslServer *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->sslErrors((*reinterpret_cast< std::add_pointer_t<QSslSocket*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[2]))); break;
        case 1: _t->peerVerifyError((*reinterpret_cast< std::add_pointer_t<QSslSocket*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSslError>>(_a[2]))); break;
        case 2: _t->errorOccurred((*reinterpret_cast< std::add_pointer_t<QSslSocket*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractSocket::SocketError>>(_a[2]))); break;
        case 3: _t->preSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QSslSocket*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[2]))); break;
        case 4: _t->alertSent((*reinterpret_cast< std::add_pointer_t<QSslSocket*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSsl::AlertLevel>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QSsl::AlertType>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[4]))); break;
        case 5: _t->alertReceived((*reinterpret_cast< std::add_pointer_t<QSslSocket*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSsl::AlertLevel>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QSsl::AlertType>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[4]))); break;
        case 6: _t->handshakeInterruptedOnError((*reinterpret_cast< std::add_pointer_t<QSslSocket*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSslError>>(_a[2]))); break;
        case 7: _t->startedEncryptionHandshake((*reinterpret_cast< std::add_pointer_t<QSslSocket*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslSocket* >(); break;
            }
            break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslSocket* >(); break;
            }
            break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractSocket::SocketError >(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslSocket* >(); break;
            }
            break;
        case 3:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslSocket* >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslSocket* >(); break;
            }
            break;
        case 5:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslSocket* >(); break;
            }
            break;
        case 6:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslSocket* >(); break;
            }
            break;
        case 7:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslSocket* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSslServer::*)(QSslSocket * , const QList<QSslError> & )>(_a, &QSslServer::sslErrors, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslServer::*)(QSslSocket * , const QSslError & )>(_a, &QSslServer::peerVerifyError, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslServer::*)(QSslSocket * , QAbstractSocket::SocketError )>(_a, &QSslServer::errorOccurred, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslServer::*)(QSslSocket * , QSslPreSharedKeyAuthenticator * )>(_a, &QSslServer::preSharedKeyAuthenticationRequired, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslServer::*)(QSslSocket * , QSsl::AlertLevel , QSsl::AlertType , const QString & )>(_a, &QSslServer::alertSent, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslServer::*)(QSslSocket * , QSsl::AlertLevel , QSsl::AlertType , const QString & )>(_a, &QSslServer::alertReceived, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslServer::*)(QSslSocket * , const QSslError & )>(_a, &QSslServer::handshakeInterruptedOnError, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslServer::*)(QSslSocket * )>(_a, &QSslServer::startedEncryptionHandshake, 7))
            return;
    }
}